

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

PhysicalIndex __thiscall
duckdb::BatchInsertGlobalState::MergeCollections
          (BatchInsertGlobalState *this,ClientContext *context,
          vector<duckdb::RowGroupBatchEntry,_true> *merge_collections,OptimisticDataWriter *writer)

{
  pointer pRVar1;
  int iVar2;
  undefined4 extraout_var;
  PhysicalIndex PVar3;
  RowGroupBatchEntry *entry;
  pointer pRVar4;
  idx_t memory_reduction;
  CollectionMerger merger;
  undefined1 local_68 [16];
  pointer local_58;
  iterator iStack_50;
  PhysicalIndex *local_48;
  RowGroupBatchType local_40;
  PhysicalIndex local_38;
  
  iVar2 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  local_68._8_8_ = CONCAT44(extraout_var,iVar2);
  local_58 = (pointer)0x0;
  iStack_50._M_current = (PhysicalIndex *)0x0;
  local_48 = (PhysicalIndex *)0x0;
  local_40 = NOT_FLUSHED;
  pRVar4 = (merge_collections->
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>).
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (merge_collections->
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>).
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68._0_8_ = context;
  if (pRVar4 == pRVar1) {
    memory_reduction = 0;
  }
  else {
    memory_reduction = 0;
    do {
      local_38.index = (pRVar4->collection_index).index;
      if (iStack_50._M_current == local_48) {
        ::std::vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>>::
        _M_realloc_insert<duckdb::PhysicalIndex_const&>
                  ((vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>> *)&local_58,
                   iStack_50,&local_38);
      }
      else {
        (iStack_50._M_current)->index = local_38.index;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      memory_reduction = memory_reduction + pRVar4->unflushed_memory;
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar1);
  }
  LOCK();
  (this->optimistically_written)._M_base._M_i = true;
  UNLOCK();
  BatchMemoryManager::ReduceUnflushedMemory(&this->memory_manager,memory_reduction);
  PVar3 = CollectionMerger::Flush((CollectionMerger *)local_68,writer);
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  return (PhysicalIndex)PVar3.index;
}

Assistant:

PhysicalIndex BatchInsertGlobalState::MergeCollections(ClientContext &context,
                                                       const vector<RowGroupBatchEntry> &merge_collections,
                                                       OptimisticDataWriter &writer) {
	D_ASSERT(!merge_collections.empty());
	CollectionMerger merger(context, table.GetStorage());
	idx_t written_data = 0;
	for (auto &entry : merge_collections) {
		merger.AddCollection(entry.collection_index, RowGroupBatchType::NOT_FLUSHED);
		written_data += entry.unflushed_memory;
	}
	optimistically_written = true;
	memory_manager.ReduceUnflushedMemory(written_data);
	return merger.Flush(writer);
}